

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTcPrsGramNode * __thiscall CTcPrsGramNodeOr::consolidate_or(CTcPrsGramNodeOr *this)

{
  CTcPrsGramNode *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  CTcPrsGramNodeWithChildren *in_RDI;
  CTcPrsGramNode *next_chi;
  CTcPrsGramNode *chi;
  CTcPrsGramNodeOr *new_or;
  CTcPrsGramNode *new_sub;
  CTcPrsGramNode *old_head;
  CTcPrsGramNode *nxt;
  CTcPrsGramNode *cur;
  CTcPrsGramNode *local_38;
  CTcPrsGramNode *local_10;
  CTcPrsGramNode *sub;
  
  local_10 = in_RDI->sub_head_;
  in_RDI->sub_tail_ = (CTcPrsGramNode *)0x0;
  in_RDI->sub_head_ = (CTcPrsGramNode *)0x0;
  while (local_10 != (CTcPrsGramNode *)0x0) {
    pCVar1 = local_10->next_;
    iVar2 = (*(local_10->super_CTcTokenSource)._vptr_CTcTokenSource[3])();
    sub = (CTcPrsGramNode *)CONCAT44(extraout_var,iVar2);
    iVar2 = (*(sub->super_CTcTokenSource)._vptr_CTcTokenSource[5])();
    local_10 = pCVar1;
    if (iVar2 == 0) {
      CTcPrsGramNodeWithChildren::add_sub_item(in_RDI,sub);
    }
    else {
      local_38 = (CTcPrsGramNode *)sub[1].super_CTcTokenSource._vptr_CTcTokenSource;
      while (local_38 != (CTcPrsGramNode *)0x0) {
        pCVar1 = local_38->next_;
        CTcPrsGramNodeWithChildren::add_sub_item(in_RDI,local_38);
        local_38 = pCVar1;
      }
      sub[1].super_CTcTokenSource.enclosing_src_ = (CTcTokenSource *)0x0;
      sub[1].super_CTcTokenSource._vptr_CTcTokenSource = (_func_int **)0x0;
    }
  }
  return &in_RDI->super_CTcPrsGramNode;
}

Assistant:

virtual CTcPrsGramNode *consolidate_or()
    {
        CTcPrsGramNode *cur;
        CTcPrsGramNode *nxt;
        CTcPrsGramNode *old_head;

        /*
         *   Consolidate OR's in all subtrees.  If any of our immediate
         *   children turn into OR's, simply pull their children into our OR
         *   list directly - OR(a, OR(b, c)) is equivalent to OR(a, b, c).
         *   
         *   Before we build the new list, stash away our entire subtree,
         *   since we'll rebuild the tree from the updated versions.  
         */
        old_head = sub_head_;
        sub_head_ = sub_tail_ = 0;

        /* run through our list and build the new, consolidated list */
        for (cur = old_head ; cur != 0 ; cur = nxt)
        {
            CTcPrsGramNode *new_sub;

            /* remember the next item in the old list */
            nxt = cur->next_;
            
            /* consolidate OR's in the subtree */
            new_sub = cur->consolidate_or();

            /* 
             *   if this is an OR node, add its children directly to us;
             *   otherwise, add the node itself
             */
            if (new_sub->is_or())
            {
                CTcPrsGramNodeOr *new_or;
                CTcPrsGramNode *chi;
                CTcPrsGramNode *next_chi;

                /* cast it */
                new_or = (CTcPrsGramNodeOr *)new_sub;

                /* add each of the sub-OR's children as our direct children */
                for (chi = new_or->sub_head_ ; chi != 0 ; chi = next_chi)
                {
                    /* remember the next child in the old sub-list */
                    next_chi = chi->next_;

                    /* move it directly to our list */
                    add_sub_item(chi);
                }

                /* the old OR item is now empty of children */
                new_or->sub_head_ = new_or->sub_tail_ = 0;
            }
            else
            {
                /* it's not an OR - add it directly to our list */
                add_sub_item(new_sub);
            }
        }

        /* return myself with no further changes */
        return this;
    }